

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O0

size_t qHash(QSslError *key,size_t seed)

{
  QHashCombine *this;
  result_type rVar1;
  QSslCertificate *in_RSI;
  long in_FS_OFFSET;
  QHashCombine hash;
  QSslError *this_00;
  QHashCombine *in_stack_ffffffffffffffc0;
  undefined1 local_9 [9];
  
  local_9._1_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_9[0] = 0xaa;
  QSslError::error((QSslError *)0x3979c9);
  this_00 = (QSslError *)local_9;
  this = (QHashCombine *)
         QtPrivate::QHashCombine::operator()
                   (in_stack_ffffffffffffffc0,(size_t)this_00,(SslError *)in_RSI);
  QSslError::certificate(this_00);
  rVar1 = QtPrivate::QHashCombine::operator()(this,(size_t)this_00,in_RSI);
  QSslCertificate::~QSslCertificate((QSslCertificate *)0x397a2c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_9._1_8_) {
    return rVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QSslError &key, size_t seed) noexcept
{
    QtPrivate::QHashCombine hash;
    seed = hash(seed, key.error());
    seed = hash(seed, key.certificate());
    return seed;
}